

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void simple_roaring_bitmap_or_many(void)

{
  roaring_bitmap_t *r;
  uint32_t i;
  uint32_t uVar1;
  roaring_bitmap_t *roaring_bitmaps [2];
  roaring_bitmap_t *local_28;
  roaring_bitmap_t *local_20;
  
  local_28 = roaring_bitmap_create_with_capacity(0);
  local_20 = roaring_bitmap_create_with_capacity(0);
  uVar1 = 100;
  do {
    roaring_bitmap_add(local_28,uVar1);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 1000);
  uVar1 = 1000;
  do {
    roaring_bitmap_add(local_20,uVar1);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 2000);
  r = roaring_bitmap_or_many(2,&local_28);
  roaring_bitmap_free(local_28);
  roaring_bitmap_free(local_20);
  roaring_bitmap_free(r);
  return;
}

Assistant:

bool roaring_iterator_sumall(uint32_t value, void *param) {
    *(uint32_t *)param += value;
    return true;  // continue till the end
}